

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O3

BOOL __thiscall Js::ModuleRoot::EnsureProperty(ModuleRoot *this,PropertyId propertyId)

{
  BOOL BVar1;
  
  BVar1 = RootObjectBase::HasOwnPropertyCheckNoRedecl(&this->super_RootObjectBase,propertyId);
  if (BVar1 == 0) {
    (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1a])
              (this,propertyId,
               (((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)
                 ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).undefinedValue.ptr,0x50,0);
  }
  return 1;
}

Assistant:

BOOL ModuleRoot::EnsureProperty(PropertyId propertyId)
    {
        if (!RootObjectBase::HasOwnPropertyCheckNoRedecl(propertyId))
        {
            // Cannot pass the extra PropertyOperation_PreInit flag, because module root uses SetSlot directly from
            // SetRootProperty. If the property is not yet initialized SetSlot will (correctly) assert.
            this->InitProperty(propertyId, this->GetLibrary()->GetUndefined(), (PropertyOperationFlags)(PropertyOperation_SpecialValue | PropertyOperation_NonFixedValue));
        }
        return true;
    }